

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O0

Format __thiscall QXcbScreen::format(QXcbScreen *this)

{
  long lVar1;
  QXcbConnection *needsRgbSwap_00;
  xcb_screen_t *pxVar2;
  xcb_visualtype_t *in_RDI;
  long in_FS_OFFSET;
  bool needsRgbSwap;
  Format format;
  xcb_visualid_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined7 in_stack_ffffffffffffffd8;
  uint8_t uVar3;
  undefined4 in_stack_ffffffffffffffec;
  uint8_t depth;
  undefined3 in_stack_fffffffffffffff0;
  undefined4 uVar4;
  Format FVar5;
  
  depth = (uint8_t)((uint)in_stack_ffffffffffffffec >> 0x18);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FVar5 = 0xaaaaaaaa;
  uVar4 = CONCAT13(0xaa,in_stack_fffffffffffffff0);
  needsRgbSwap_00 = QXcbObject::connection((QXcbObject *)&in_RDI->blue_mask);
  pxVar2 = screen((QXcbScreen *)0x1cfcba);
  uVar3 = pxVar2->root_depth;
  screen((QXcbScreen *)0x1cfccb);
  visualForId((QXcbScreen *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffbc);
  qt_xcb_imageFormatForVisual
            ((QXcbConnection *)CONCAT44(FVar5,uVar4),depth,in_RDI,
             (Format *)CONCAT17(uVar3,in_stack_ffffffffffffffd8),(bool *)needsRgbSwap_00);
  if (FVar5 == Format_Invalid) {
    FVar5 = Format_RGB32;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return FVar5;
}

Assistant:

QImage::Format QXcbScreen::format() const
{
    QImage::Format format;
    bool needsRgbSwap;
    qt_xcb_imageFormatForVisual(connection(), screen()->root_depth, visualForId(screen()->root_visual), &format, &needsRgbSwap);
    // We are ignoring needsRgbSwap here and just assumes the backing-store will handle it.
    if (format != QImage::Format_Invalid)
        return format;
    return QImage::Format_RGB32;
}